

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall
tetgenmesh::getsteinerptonsegment(tetgenmesh *this,face *seg,point refpt,point steinpt)

{
  int iVar1;
  shellface *pppdVar2;
  shellface e1;
  shellface e2;
  point *ppdVar3;
  double *p1;
  double *p2;
  long lVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  
  pppdVar2 = seg->sh;
  e1 = pppdVar2[sorgpivot[seg->shver]];
  e2 = pppdVar2[sdestpivot[seg->shver]];
  if (refpt == (point)0x0) {
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      steinpt[lVar4] = ((double)e2[lVar4] - (double)e1[lVar4]) * 0.5 + (double)e1[lVar4];
    }
    return 0;
  }
  if ((*(uint *)((long)refpt + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0x600) {
    iVar5 = *(int *)(((ulong)refpt[(long)this->point2simindex + 2] & 0xfffffffffffffff8) + 8 +
                    (long)this->shmarkindex * 4);
    ppdVar3 = this->segmentendpointslist;
    iVar1 = *(int *)((long)pppdVar2 + (long)this->shmarkindex * 4 + 8);
    p1 = ppdVar3[(long)iVar1 * 2];
    p2 = ppdVar3[iVar1 * 2 + 1];
    if ((ppdVar3[(long)iVar5 * 2] == p1) || (ppdVar3[iVar5 * 2 + 1] == p1)) {
      dVar6 = distance(this,p1,p2);
      dVar7 = distance(this,p1,refpt);
      for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
        steinpt[lVar4] = (p2[lVar4] - p1[lVar4]) * (dVar7 / dVar6) + p1[lVar4];
      }
    }
    else {
      if ((ppdVar3[(long)iVar5 * 2] != p2) && (ppdVar3[iVar5 * 2 + 1] != p2)) goto LAB_0012cd0b;
      dVar6 = distance(this,p1,p2);
      dVar7 = distance(this,p2,refpt);
      for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
        steinpt[lVar4] = (p1[lVar4] - p2[lVar4]) * (dVar7 / dVar6) + p2[lVar4];
      }
    }
    iVar5 = 1;
  }
  else {
LAB_0012cd0b:
    projpt2edge(this,refpt,(double *)e1,(double *)e2,steinpt);
    iVar5 = 0;
  }
  dVar6 = distance(this,(double *)e1,(double *)e2);
  dVar7 = distance(this,steinpt,(double *)e1);
  if ((dVar7 / dVar6 < 0.2) || (0.8 < dVar7 / dVar6)) {
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      steinpt[lVar4] = ((double)e2[lVar4] - (double)e1[lVar4]) * 0.5 + (double)e1[lVar4];
    }
  }
  return iVar5;
}

Assistant:

int tetgenmesh::getsteinerptonsegment(face* seg, point refpt, point steinpt)
{
  point ei = sorg(*seg);
  point ej = sdest(*seg);
  int adjflag = 0, i;

  if (refpt != NULL) {
    REAL L, L1, t;
  
    if (pointtype(refpt) == FREESEGVERTEX) {
      face parentseg;
      sdecode(point2sh(refpt), parentseg);
      int sidx1 = getfacetindex(parentseg);
      point far_pi = segmentendpointslist[sidx1 * 2];
      point far_pj = segmentendpointslist[sidx1 * 2 + 1];
      int sidx2 = getfacetindex(*seg);
      point far_ei = segmentendpointslist[sidx2 * 2];
      point far_ej = segmentendpointslist[sidx2 * 2 + 1];
      if ((far_pi == far_ei) || (far_pj == far_ei)) {
        // Create a Steiner point at the intersection of the segment
        //   [far_ei, far_ej] and the sphere centered at far_ei with 
        //   radius |far_ei - refpt|.
        L = distance(far_ei, far_ej);
        L1 = distance(far_ei, refpt);
        t = L1 / L;
        for (i = 0; i < 3; i++) {
          steinpt[i] = far_ei[i] + t * (far_ej[i] - far_ei[i]);
        }
        adjflag = 1;
      } else if ((far_pi == far_ej) || (far_pj == far_ej)) {
        L = distance(far_ei, far_ej);
        L1 = distance(far_ej, refpt);
        t = L1 / L;
        for (i = 0; i < 3; i++) {
          steinpt[i] = far_ej[i] + t * (far_ei[i] - far_ej[i]);
        }
        adjflag = 1;
      } else {
        // Cut the segment by the projection point of refpt.
        projpt2edge(refpt, ei, ej, steinpt);
      }
    } else {
      // Cut the segment by the projection point of refpt.
      projpt2edge(refpt, ei, ej, steinpt);
    }

    // Make sure that steinpt is not too close to ei and ej.
    L = distance(ei, ej);
    L1 = distance(steinpt, ei);
    t = L1 / L;
    if ((t < 0.2) || (t > 0.8)) {
      // Split the point at the middle.
      for (i = 0; i < 3; i++) {
        steinpt[i] = ei[i] + 0.5 * (ej[i] - ei[i]);
      }
    }
  } else {
    // Split the point at the middle.
    for (i = 0; i < 3; i++) {
      steinpt[i] = ei[i] + 0.5 * (ej[i] - ei[i]);
    }
  }


  return adjflag;
}